

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

RPCHelpMan * wallet::gethdkeys(void)

{
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  RPCExamples examples;
  string description_09;
  string description_10;
  string description_11;
  RPCMethodImpl fun;
  vector<RPCArg,_std::allocator<RPCArg>_> inner;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_05;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_06;
  undefined4 in_stack_ffffffffffffec58;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffec5c;
  RPCArgOptions *pRVar3;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffec60;
  undefined8 in_stack_ffffffffffffec68;
  undefined8 in_stack_ffffffffffffec70;
  _Manager_type in_stack_ffffffffffffec78;
  undefined8 in_stack_ffffffffffffec80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffec88;
  _Vector_impl_data in_stack_ffffffffffffec98;
  _Vector_impl_data in_stack_ffffffffffffecb0;
  undefined1 in_stack_ffffffffffffecc8 [16];
  pointer in_stack_ffffffffffffecd8;
  pointer pRVar5;
  pointer in_stack_ffffffffffffece0;
  pointer pRVar6;
  pointer in_stack_ffffffffffffece8;
  pointer pRVar7;
  undefined8 in_stack_ffffffffffffecf0;
  pointer in_stack_ffffffffffffecf8;
  pointer pRVar8;
  pointer in_stack_ffffffffffffed00;
  pointer pRVar9;
  pointer in_stack_ffffffffffffed08;
  undefined1 auVar10 [32];
  undefined1 in_stack_ffffffffffffed10 [48];
  undefined1 in_stack_ffffffffffffed40 [24];
  vector<RPCResult,_std::allocator<RPCResult>_> local_12a8;
  allocator<char> local_128a;
  allocator<char> local_1289;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1288;
  allocator<char> local_126a;
  allocator<char> local_1269;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1268;
  allocator<char> local_1242;
  allocator<char> local_1241;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1240;
  allocator<char> local_1222;
  allocator<char> local_1221;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1220;
  allocator<char> local_1202;
  allocator<char> local_1201;
  RPCResults local_1200;
  allocator_type local_11e8;
  allocator_type local_11e7;
  allocator<char> local_11e6;
  bool local_11e5;
  allocator<char> local_11e4;
  allocator<char> local_11e3;
  bool local_11e2;
  allocator<char> local_11e1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_11e0;
  allocator<char> local_11c2;
  allocator<char> local_11c1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_11c0;
  allocator<char> local_11a2;
  allocator<char> local_11a1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_11a0 [2];
  string local_10b0;
  string local_1090;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1070 [2];
  string local_f80;
  string local_f60;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  string local_ec0;
  string local_ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e40;
  char *local_e20;
  size_type local_e18;
  char local_e10 [8];
  undefined8 uStack_e08;
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  RPCResult local_d80 [2];
  string local_c70 [32];
  string local_c50 [32];
  RPCResult local_c30;
  string local_ba8 [32];
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  RPCResult local_aa8 [4];
  string local_888 [32];
  string local_868 [32];
  RPCResult local_848;
  string local_7c0 [32];
  string local_7a0 [32];
  RPCResult local_780;
  RPCArgOptions local_6f8;
  RPCArgOptions local_6b0;
  string local_668 [32];
  UniValue local_648;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5f0;
  string local_590 [32];
  RPCArgOptions local_570;
  string local_528 [32];
  UniValue local_508;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4b0;
  string local_450 [32];
  RPCArg local_430 [2];
  string local_220 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  string local_1a0 [32];
  RPCArg local_180;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1070[0].second.val.field_2._8_8_ = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"gethdkeys",&local_11a1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"\nList all BIP 32 HD keys in the wallet and which descriptors use them.\n",
             &local_11a2);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"options",&local_11c1);
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_1a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_220,"",&local_11c2);
  std::__cxx11::string::string<std::allocator<char>>(local_450,"active_only",&local_11e1);
  local_11e2 = false;
  UniValue::UniValue<bool,_bool,_true>(&local_508,&local_11e2);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_4b0,&local_508);
  std::__cxx11::string::string<std::allocator<char>>
            (local_528,"Show the keys for only active descriptors",&local_11e3);
  local_570.oneline_description._M_dataplus._M_p = (pointer)&local_570.oneline_description.field_2;
  local_570.skip_type_check = false;
  local_570.oneline_description._M_string_length = 0;
  local_570.oneline_description.field_2._M_local_buf[0] = '\0';
  local_570.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_570.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_570.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_570.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_570._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec5c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec58;
  name._M_string_length = in_stack_ffffffffffffec60;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  name.field_2._8_8_ = in_stack_ffffffffffffec70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffec80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffec78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffec88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffec98._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffec98._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec98._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffecb0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffecb0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffecb0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffecc8;
  description_09._M_string_length = (size_type)in_stack_ffffffffffffece0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecd8;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffece8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffecf0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed00;
  opts._0_8_ = in_stack_ffffffffffffecf8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffed08;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed10._0_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffed10._16_24_;
  opts.hidden = (bool)in_stack_ffffffffffffed10[0x28];
  opts.also_positional = (bool)in_stack_ffffffffffffed10[0x29];
  opts._66_6_ = in_stack_ffffffffffffed10._42_6_;
  RPCArg::RPCArg(local_430,name,(Type)local_450,fallback,description_09,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_590,"private",&local_11e4);
  local_11e5 = false;
  UniValue::UniValue<bool,_bool,_true>(&local_648,&local_11e5);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_5f0,&local_648);
  std::__cxx11::string::string<std::allocator<char>>(local_668,"Show private keys",&local_11e6);
  local_6b0.oneline_description._M_dataplus._M_p = (pointer)&local_6b0.oneline_description.field_2;
  local_6b0.skip_type_check = false;
  local_6b0.oneline_description._M_string_length = 0;
  local_6b0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_6b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_6b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_6b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_6b0._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec5c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec58;
  name_00._M_string_length = in_stack_ffffffffffffec60;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  name_00.field_2._8_8_ = in_stack_ffffffffffffec70;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffec80;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffec78;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffec88;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffec98._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffec98._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec98._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffecb0._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffecb0._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffecb0._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffecc8;
  description_10._M_string_length = (size_type)in_stack_ffffffffffffece0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecd8;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffece8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffecf0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed00;
  opts_00._0_8_ = in_stack_ffffffffffffecf8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffed08;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed10._0_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffed10._16_24_;
  opts_00.hidden = (bool)in_stack_ffffffffffffed10[0x28];
  opts_00.also_positional = (bool)in_stack_ffffffffffffed10[0x29];
  opts_00._66_6_ = in_stack_ffffffffffffed10._42_6_;
  RPCArg::RPCArg(local_430 + 1,name_00,(Type)local_590,fallback_00,description_10,opts_00);
  __l._M_len = 2;
  __l._M_array = local_430;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_11e0,__l,&local_11e7);
  local_6f8.oneline_description._M_dataplus._M_p = (pointer)&local_6f8.oneline_description.field_2;
  local_6f8.skip_type_check = false;
  local_6f8.oneline_description._M_string_length = 0;
  local_6f8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_6f8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6f8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_6f8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_6f8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_6f8._58_8_ = 0;
  pRVar3 = &local_6f8;
  name_01._M_string_length = in_stack_ffffffffffffec60;
  name_01._M_dataplus._M_p = &pRVar3->skip_type_check;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  name_01.field_2._8_8_ = in_stack_ffffffffffffec70;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffec80;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffec78;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffec88;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffec98._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffec98._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec98._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffecb0._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffecb0._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffecb0._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffecc8;
  description_11._M_string_length = (size_type)in_stack_ffffffffffffece0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecd8;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffece8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffecf0;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffed00;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffecf8;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffed08;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffed40._0_8_;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffed40._8_8_;
  opts_01.hidden = (bool)in_stack_ffffffffffffed40[0x10];
  opts_01.also_positional = (bool)in_stack_ffffffffffffed40[0x11];
  opts_01._66_6_ = in_stack_ffffffffffffed40._18_6_;
  auVar10 = in_stack_ffffffffffffed10._8_32_;
  opts_01.skip_type_check = (bool)in_stack_ffffffffffffed10[0];
  opts_01._1_7_ = in_stack_ffffffffffffed10._1_7_;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)auVar10._0_8_;
  opts_01.oneline_description._M_string_length = auVar10._8_8_;
  opts_01.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar10._16_16_;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffed10._40_8_;
  RPCArg::RPCArg(&local_180,name_01,(Type)local_1a0,fallback_01,description_11,inner,opts_01);
  __l_00._M_len = 1;
  __l_00._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_11c0,__l_00,&local_11e8);
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"",&local_1201);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"",&local_1202);
  std::__cxx11::string::string<std::allocator<char>>(local_868,"",&local_1221);
  std::__cxx11::string::string<std::allocator<char>>(local_888,"",&local_1222);
  std::__cxx11::string::string<std::allocator<char>>(local_ac8,"xpub",&local_1241);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ae8,"The extended public key",&local_1242);
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_ffffffffffffec60;
  m_key_name._M_dataplus._M_p = &pRVar3->skip_type_check;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffec70;
  description._M_string_length = in_stack_ffffffffffffec80;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description.field_2 = in_stack_ffffffffffffec88;
  RPCResult::RPCResult
            (local_aa8,STR,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffec98,
             SUB81(local_ac8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b08,"has_private",&local_1269);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b28,"Whether the wallet has the private key for this xpub",&local_126a);
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_ffffffffffffec60;
  m_key_name_00._M_dataplus._M_p = &pRVar3->skip_type_check;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffec70;
  description_00._M_string_length = in_stack_ffffffffffffec80;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_00.field_2 = in_stack_ffffffffffffec88;
  RPCResult::RPCResult
            (local_aa8 + 1,BOOL,m_key_name_00,description_00,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffec98,
             SUB81(local_b08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b48,"xprv",&local_1289);
  uVar4 = (undefined4)((ulong)pRVar3 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b68,"The extended private key if \"private\" is true",&local_128a);
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0;
  auVar10._4_8_ = in_stack_ffffffffffffec60;
  auVar10._0_4_ = uVar4;
  auVar10._12_8_ = in_stack_ffffffffffffec68;
  auVar10._20_8_ = in_stack_ffffffffffffec70;
  auVar10._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffec80;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_01.field_2 = in_stack_ffffffffffffec88;
  RPCResult::RPCResult
            (local_aa8 + 2,STR,(string)(auVar10 << 0x20),SUB81(local_b48,0),description_01,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffec98,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b88,"descriptors",(allocator<char> *)&stack0xffffffffffffed57);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ba8,"Array of descriptor objects that use this HD key",
             (allocator<char> *)&stack0xffffffffffffed56);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c50,"",(allocator<char> *)&stack0xffffffffffffed37);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c70,"",(allocator<char> *)&stack0xffffffffffffed36);
  std::__cxx11::string::string<std::allocator<char>>
            (local_da0,"desc",(allocator<char> *)&stack0xffffffffffffed17);
  std::__cxx11::string::string<std::allocator<char>>
            (local_dc0,"Descriptor string representation",
             (allocator<char> *)&stack0xffffffffffffed16);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = uVar4;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar2;
  m_key_name_01._M_string_length = in_stack_ffffffffffffec60;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffec70;
  description_02._M_string_length = in_stack_ffffffffffffec80;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_02.field_2 = in_stack_ffffffffffffec88;
  RPCResult::RPCResult
            (local_d80,STR,m_key_name_01,description_02,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffec98,
             SUB81(local_da0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_de0,"active",(allocator<char> *)&stack0xffffffffffffecf7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e00,"Whether this descriptor is currently used to generate new addresses",
             (allocator<char> *)&stack0xffffffffffffecf6);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = uVar4;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar2;
  m_key_name_02._M_string_length = in_stack_ffffffffffffec60;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffec70;
  description_03._M_string_length = in_stack_ffffffffffffec80;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_03.field_2._M_local_buf = in_stack_ffffffffffffec88._M_local_buf;
  RPCResult::RPCResult
            (local_d80 + 1,BOOL,m_key_name_02,description_03,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffec98,
             SUB81(local_de0,0));
  __l_01._M_len = 2;
  __l_01._M_array = local_d80;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed18,__l_01,
             (allocator_type *)&stack0xffffffffffffecd7);
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar4;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar2;
  m_key_name_03._M_string_length = in_stack_ffffffffffffec60;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffec70;
  description_04._M_string_length = in_stack_ffffffffffffec80;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_04.field_2._M_local_buf = in_stack_ffffffffffffec88._M_local_buf;
  RPCResult::RPCResult
            (&local_c30,OBJ,m_key_name_03,description_04,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffec98,
             SUB81(local_c50,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_c30;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed38,__l_02,
             (allocator_type *)&stack0xffffffffffffecd6);
  m_key_name_04._M_dataplus._M_p._4_4_ = uVar4;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar2;
  m_key_name_04._M_string_length = in_stack_ffffffffffffec60;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffec70;
  description_05._M_string_length = in_stack_ffffffffffffec80;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_05.field_2._M_local_buf = in_stack_ffffffffffffec88._M_local_buf;
  RPCResult::RPCResult
            (local_aa8 + 3,ARR,m_key_name_04,description_05,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffec98,
             SUB81(local_b88,0));
  __l_03._M_len = 4;
  __l_03._M_array = local_aa8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1240,__l_03,(allocator_type *)&stack0xffffffffffffecd5);
  m_key_name_05._M_dataplus._M_p._4_4_ = uVar4;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar2;
  m_key_name_05._M_string_length = in_stack_ffffffffffffec60;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffec70;
  description_06._M_string_length = in_stack_ffffffffffffec80;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_06.field_2._M_local_buf = in_stack_ffffffffffffec88._M_local_buf;
  RPCResult::RPCResult
            (&local_848,OBJ,m_key_name_05,description_06,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffec98,
             SUB81(local_868,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_848;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1220,__l_04,(allocator_type *)&stack0xffffffffffffecd4);
  m_key_name_06._M_dataplus._M_p._4_4_ = uVar4;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar2;
  m_key_name_06._M_string_length = in_stack_ffffffffffffec60;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffec68;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffec70;
  description_07._M_string_length = in_stack_ffffffffffffec80;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_07.field_2 = in_stack_ffffffffffffec88;
  RPCResult::RPCResult
            (&local_780,ARR,m_key_name_06,description_07,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffec98,
             SUB81(local_7a0,0));
  result._4_4_ = uVar4;
  result.m_type = uVar2;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec60;
  result.m_key_name._M_string_length = in_stack_ffffffffffffec68;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffec70;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffec78;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffec80;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffec88;
  result._64_24_ = in_stack_ffffffffffffec98;
  result._88_24_ = in_stack_ffffffffffffecb0;
  result.m_cond._8_16_ = in_stack_ffffffffffffecc8;
  result.m_cond.field_2._8_8_ = pRVar5;
  RPCResults::RPCResults(&local_1200,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ec0,"gethdkeys",(allocator<char> *)&stack0xffffffffffffecd3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ee0,"",(allocator<char> *)&stack0xffffffffffffecd2);
  HelpExampleCli(&local_ea0,&local_ec0,&local_ee0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f20,"gethdkeys",(allocator<char> *)&stack0xffffffffffffecd1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f40,"",(allocator<char> *)&stack0xffffffffffffecd0);
  HelpExampleRpc(&local_f00,&local_f20,&local_f40);
  std::operator+(&local_e80,&local_ea0,&local_f00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f80,"gethdkeys",(allocator<char> *)&stack0xffffffffffffeccf);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[5],_true>
            (local_1070,(char (*) [12])"active_only",(char (*) [5])0x4101ab);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[8],_const_char_(&)[5],_true>
            (local_1070 + 1,(char (*) [8])0x3fb290,(char (*) [5])0x4101ab);
  __l_05._M_len = 2;
  __l_05._M_array = local_1070;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xffffffffffffecb0,__l_05,(allocator_type *)&stack0xffffffffffffecaf);
  HelpExampleCliNamed(&local_f60,&local_f80,(RPCArgList *)&stack0xffffffffffffecb0);
  std::operator+(&local_e60,&local_e80,&local_f60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10b0,"gethdkeys",(allocator<char> *)&stack0xffffffffffffecae);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[5],_true>
            (local_11a0,(char (*) [12])"active_only",(char (*) [5])0x4101ab);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[8],_const_char_(&)[5],_true>
            (local_11a0 + 1,(char (*) [8])0x3fb290,(char (*) [5])0x4101ab);
  __l_06._M_len = 2;
  __l_06._M_array = local_11a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xffffffffffffec90,__l_06,(allocator_type *)&stack0xffffffffffffec8f);
  HelpExampleRpcNamed(&local_1090,&local_10b0,(RPCArgList *)&stack0xffffffffffffec90);
  std::operator+(&local_e40,&local_e60,&local_1090);
  local_e20 = local_e10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e40._M_dataplus._M_p == &local_e40.field_2) {
    uStack_e08 = local_e40.field_2._8_8_;
  }
  else {
    local_e20 = local_e40._M_dataplus._M_p;
  }
  local_e18 = local_e40._M_string_length;
  local_e40._M_string_length = 0;
  local_e40.field_2._M_local_buf[0] = '\0';
  description_08._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/wallet.cpp:849:9)>
       ::_M_invoke;
  description_08._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/wallet.cpp:849:9)>
                ::_M_manager;
  description_08.field_2 = in_stack_ffffffffffffec88;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar5;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecc8._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffecc8._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar6;
  fun.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffecf0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar7;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar8;
  fun._M_invoker = (_Invoker_type)pRVar9;
  local_e40._M_dataplus._M_p = (pointer)&local_e40.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffec60,&stack0xffffffffffffec68)),
             description_08,(vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_ffffffffffffec98,
             (RPCResults)in_stack_ffffffffffffecb0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffec68);
  std::__cxx11::string::~string((string *)&local_e20);
  std::__cxx11::string::~string((string *)&local_e40);
  std::__cxx11::string::~string((string *)&local_1090);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xffffffffffffec90);
  lVar1 = 0x78;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)((long)&local_11a0[0].first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x78;
  } while (lVar1 != -0x78);
  std::__cxx11::string::~string((string *)&local_10b0);
  std::__cxx11::string::~string((string *)&local_e60);
  std::__cxx11::string::~string((string *)&local_f60);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xffffffffffffecb0);
  lVar1 = 0x78;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)((long)&local_1070[0].first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x78;
  } while (lVar1 != -0x78);
  std::__cxx11::string::~string((string *)&local_f80);
  std::__cxx11::string::~string((string *)&local_e80);
  std::__cxx11::string::~string((string *)&local_f00);
  std::__cxx11::string::~string((string *)&local_f40);
  std::__cxx11::string::~string((string *)&local_f20);
  std::__cxx11::string::~string((string *)&local_ea0);
  std::__cxx11::string::~string((string *)&local_ee0);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1200.m_results);
  RPCResult::~RPCResult(&local_780);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1220);
  RPCResult::~RPCResult(&local_848);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1240);
  lVar1 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_aa8[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed38);
  RPCResult::~RPCResult(&local_c30);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed18);
  lVar1 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_d80[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffecd8);
  std::__cxx11::string::~string(local_e00);
  std::__cxx11::string::~string(local_de0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffecf8);
  std::__cxx11::string::~string(local_dc0);
  std::__cxx11::string::~string(local_da0);
  std::__cxx11::string::~string(local_c70);
  std::__cxx11::string::~string(local_c50);
  std::__cxx11::string::~string(local_ba8);
  std::__cxx11::string::~string(local_b88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12a8);
  std::__cxx11::string::~string(local_b68);
  std::__cxx11::string::~string(local_b48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1288);
  std::__cxx11::string::~string(local_b28);
  std::__cxx11::string::~string(local_b08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1268);
  std::__cxx11::string::~string(local_ae8);
  std::__cxx11::string::~string(local_ac8);
  std::__cxx11::string::~string(local_888);
  std::__cxx11::string::~string(local_868);
  std::__cxx11::string::~string(local_7c0);
  std::__cxx11::string::~string(local_7a0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_11c0);
  RPCArg::~RPCArg(&local_180);
  RPCArgOptions::~RPCArgOptions(&local_6f8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_11e0);
  lVar1 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_430[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_6b0);
  std::__cxx11::string::~string(local_668);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_5f0);
  UniValue::~UniValue(&local_648);
  std::__cxx11::string::~string(local_590);
  RPCArgOptions::~RPCArgOptions(&local_570);
  std::__cxx11::string::~string(local_528);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_4b0);
  UniValue::~UniValue(&local_508);
  std::__cxx11::string::~string(local_450);
  std::__cxx11::string::~string(local_220);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan gethdkeys()
{
    return RPCHelpMan{
        "gethdkeys",
        "\nList all BIP 32 HD keys in the wallet and which descriptors use them.\n",
        {
            {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "", {
                {"active_only", RPCArg::Type::BOOL, RPCArg::Default{false}, "Show the keys for only active descriptors"},
                {"private", RPCArg::Type::BOOL, RPCArg::Default{false}, "Show private keys"}
            }},
        },
        RPCResult{RPCResult::Type::ARR, "", "", {
            {
                {RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::STR, "xpub", "The extended public key"},
                    {RPCResult::Type::BOOL, "has_private", "Whether the wallet has the private key for this xpub"},
                    {RPCResult::Type::STR, "xprv", /*optional=*/true, "The extended private key if \"private\" is true"},
                    {RPCResult::Type::ARR, "descriptors", "Array of descriptor objects that use this HD key",
                    {
                        {RPCResult::Type::OBJ, "", "", {
                            {RPCResult::Type::STR, "desc", "Descriptor string representation"},
                            {RPCResult::Type::BOOL, "active", "Whether this descriptor is currently used to generate new addresses"},
                        }},
                    }},
                }},
            }
        }},
        RPCExamples{
            HelpExampleCli("gethdkeys", "") + HelpExampleRpc("gethdkeys", "")
            + HelpExampleCliNamed("gethdkeys", {{"active_only", "true"}, {"private", "true"}}) + HelpExampleRpcNamed("gethdkeys", {{"active_only", "true"}, {"private", "true"}})
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const std::shared_ptr<const CWallet> wallet = GetWalletForJSONRPCRequest(request);
            if (!wallet) return UniValue::VNULL;

            if (!wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                throw JSONRPCError(RPC_WALLET_ERROR, "gethdkeys is not available for non-descriptor wallets");
            }

            LOCK(wallet->cs_wallet);

            UniValue options{request.params[0].isNull() ? UniValue::VOBJ : request.params[0]};
            const bool active_only{options.exists("active_only") ? options["active_only"].get_bool() : false};
            const bool priv{options.exists("private") ? options["private"].get_bool() : false};
            if (priv) {
                EnsureWalletIsUnlocked(*wallet);
            }


            std::set<ScriptPubKeyMan*> spkms;
            if (active_only) {
                spkms = wallet->GetActiveScriptPubKeyMans();
            } else {
                spkms = wallet->GetAllScriptPubKeyMans();
            }

            std::map<CExtPubKey, std::set<std::tuple<std::string, bool, bool>>> wallet_xpubs;
            std::map<CExtPubKey, CExtKey> wallet_xprvs;
            for (auto* spkm : spkms) {
                auto* desc_spkm{dynamic_cast<DescriptorScriptPubKeyMan*>(spkm)};
                CHECK_NONFATAL(desc_spkm);
                LOCK(desc_spkm->cs_desc_man);
                WalletDescriptor w_desc = desc_spkm->GetWalletDescriptor();

                // Retrieve the pubkeys from the descriptor
                std::set<CPubKey> desc_pubkeys;
                std::set<CExtPubKey> desc_xpubs;
                w_desc.descriptor->GetPubKeys(desc_pubkeys, desc_xpubs);
                for (const CExtPubKey& xpub : desc_xpubs) {
                    std::string desc_str;
                    bool ok = desc_spkm->GetDescriptorString(desc_str, false);
                    CHECK_NONFATAL(ok);
                    wallet_xpubs[xpub].emplace(desc_str, wallet->IsActiveScriptPubKeyMan(*spkm), desc_spkm->HasPrivKey(xpub.pubkey.GetID()));
                    if (std::optional<CKey> key = priv ? desc_spkm->GetKey(xpub.pubkey.GetID()) : std::nullopt) {
                        wallet_xprvs[xpub] = CExtKey(xpub, *key);
                    }
                }
            }

            UniValue response(UniValue::VARR);
            for (const auto& [xpub, descs] : wallet_xpubs) {
                bool has_xprv = false;
                UniValue descriptors(UniValue::VARR);
                for (const auto& [desc, active, has_priv] : descs) {
                    UniValue d(UniValue::VOBJ);
                    d.pushKV("desc", desc);
                    d.pushKV("active", active);
                    has_xprv |= has_priv;

                    descriptors.push_back(std::move(d));
                }
                UniValue xpub_info(UniValue::VOBJ);
                xpub_info.pushKV("xpub", EncodeExtPubKey(xpub));
                xpub_info.pushKV("has_private", has_xprv);
                if (priv) {
                    xpub_info.pushKV("xprv", EncodeExtKey(wallet_xprvs.at(xpub)));
                }
                xpub_info.pushKV("descriptors", std::move(descriptors));

                response.push_back(std::move(xpub_info));
            }

            return response;
        },
    };
}